

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeActionObservationHistories(PlanningUnitMADPDiscrete *this)

{
  bool bVar1;
  reference ppAVar2;
  __normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  *in_RDI;
  iterator last;
  iterator it;
  vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
  *in_stack_ffffffffffffffc8;
  ActionObservationHistoryTree *in_stack_ffffffffffffffd0;
  __normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (ActionObservationHistoryTree **)
       std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::end
            (in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
              ::operator*(local_10);
    if (*ppAVar2 != (ActionObservationHistoryTree *)0x0) {
      ppAVar2 = __gnu_cxx::
                __normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                ::operator*(local_10);
      in_stack_ffffffffffffffd0 = *ppAVar2;
      if (in_stack_ffffffffffffffd0 != (ActionObservationHistoryTree *)0x0) {
        (*(in_stack_ffffffffffffffd0->super_TreeNode<ActionObservationHistory>)._vptr_TreeNode[1])()
        ;
      }
    }
    __gnu_cxx::
    __normal_iterator<ActionObservationHistoryTree_**,_std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
    ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
  clear((vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_> *)
        0x9d3808);
  std::
  vector<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
  ::clear((vector<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
           *)0x9d3819);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d382a);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x9d383b);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           *)0x9d384c);
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeActionObservationHistories()
{
    vector<ActionObservationHistoryTree *>::iterator it = 
    _m_actionObservationHistoryTreeRootPointers.begin();
    vector<ActionObservationHistoryTree *>::iterator last = 
    _m_actionObservationHistoryTreeRootPointers.end();
    while(it != last)
    {
        if( *it != 0 ) 
            delete *it;    //this recursively deletes the 
                //whole ActionObservationHistoryTree
        it++;
    }
    _m_actionObservationHistoryTreeRootPointers.clear();
    _m_actionObservationHistoryTreeVectors.clear();
    _m_nrActionObservationHistories.clear();
    _m_nrActionObservationHistoriesT.clear(); 
    _m_firstAOHIforT.clear();
}